

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  runtime_error *e;
  string local_30 [8];
  string sentence;
  
  sentence.field_2._12_4_ = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Enter a sentence terminated by dot and press enter. ");
  std::operator<<(poVar1,"\nThere must be a space character after last word in sentence and dot.\n")
  ;
  readSentence_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,"OK");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
	std::cout << "Enter a sentence terminated by dot and press enter. "
			  << "\nThere must be a space character after last word in sentence and dot.\n";

	try
	{
		auto sentence = readSentence();
		std::cout << "OK" << std::endl;
	}
	catch (std::runtime_error& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}